

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5UnicodeCategory(u32 iCode)

{
  uint uVar1;
  int iVar2;
  int iTest;
  uint uStack_1c;
  u16 iKey;
  int ret;
  int iLo;
  int iHi;
  int iRes;
  u32 iCode_local;
  
  iLo = -1;
  if (iCode < 0x100000) {
    uStack_1c = (uint)aFts5UnicodeBlock[iCode >> 0x10];
    uVar1 = (uint)aFts5UnicodeBlock[(iCode >> 0x10) + 1];
    while (ret = uVar1, (int)uStack_1c < ret) {
      iVar2 = (int)(ret + uStack_1c) / 2;
      uVar1 = iVar2;
      if ((uint)aFts5UnicodeMap[iVar2] <= (iCode & 0xffff)) {
        uStack_1c = iVar2 + 1;
        uVar1 = ret;
        iLo = iVar2;
      }
    }
    if (iLo < 0) {
      iRes = 0;
    }
    else if ((iCode & 0xffff) < (uint)aFts5UnicodeMap[iLo] + ((int)(uint)aFts5UnicodeData[iLo] >> 5)
            ) {
      iRes = aFts5UnicodeData[iLo] & 0x1f;
      if ((iRes == 0x1e) && (iRes = 9, ((short)iCode - aFts5UnicodeMap[iLo] & 1) != 0)) {
        iRes = 5;
      }
    }
    else {
      iRes = 0;
    }
  }
  else {
    iRes = 0;
  }
  return iRes;
}

Assistant:

static int sqlite3Fts5UnicodeCategory(u32 iCode) { 
  int iRes = -1;
  int iHi;
  int iLo;
  int ret;
  u16 iKey;

  if( iCode>=(1<<20) ){
    return 0;
  }
  iLo = aFts5UnicodeBlock[(iCode>>16)];
  iHi = aFts5UnicodeBlock[1+(iCode>>16)];
  iKey = (iCode & 0xFFFF);
  while( iHi>iLo ){
    int iTest = (iHi + iLo) / 2;
    assert( iTest>=iLo && iTest<iHi );
    if( iKey>=aFts5UnicodeMap[iTest] ){
      iRes = iTest;
      iLo = iTest+1;
    }else{
      iHi = iTest;
    }
  }

  if( iRes<0 ) return 0;
  if( iKey>=(aFts5UnicodeMap[iRes]+(aFts5UnicodeData[iRes]>>5)) ) return 0;
  ret = aFts5UnicodeData[iRes] & 0x1F;
  if( ret!=30 ) return ret;
  return ((iKey - aFts5UnicodeMap[iRes]) & 0x01) ? 5 : 9;
}